

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Argument::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Argument *this,PatternList *left)

{
  element_type *peVar1;
  undefined8 uVar2;
  long lVar3;
  value *__args_1;
  long lVar4;
  pointer psVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  psVar5 = (left->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar5;
  lVar6 = 0;
  local_50.field_2._M_allocated_capacity = (size_type)this;
  local_50.field_2._8_8_ = __return_storage_ptr__;
  while( true ) {
    if (lVar4 >> 4 == lVar6) {
      return (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)local_50.field_2._8_8_;
    }
    peVar1 = (psVar5->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (lVar3 = __dynamic_cast(peVar1,&Pattern::typeinfo,&typeinfo,0),
       uVar2 = local_50.field_2._8_8_, lVar3 != 0)) break;
    lVar6 = lVar6 + 1;
    psVar5 = psVar5 + 1;
  }
  *(long *)local_50.field_2._8_8_ = lVar6;
  __args_1 = (value *)(**(code **)(*(long *)local_50.field_2._M_allocated_capacity + 0x18))();
  std::make_shared<docopt::Argument,std::__cxx11::string_const&,docopt::value_const&>
            (&local_50,__args_1);
  std::__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<docopt::LeafPattern,(__gnu_cxx::_Lock_policy)2> *)(uVar2 + 8),
             (__shared_ptr<docopt::Argument,_(__gnu_cxx::_Lock_policy)2> *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  return (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *)local_50.field_2._8_8_;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Argument::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				ret.first = i;
				ret.second = std::make_shared<Argument>(name(), arg->getValue());
				break;
			}
		}

		return ret;
	}